

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O3

void __thiscall
wasm::SimplifyLocals<true,_true,_true>::optimizeIfElseReturn
          (SimplifyLocals<true,_true,_true> *this,If *iff,Expression **currp,Sinkables *ifTrue)

{
  If *__x;
  pointer *pppIVar1;
  Block *pBVar2;
  Expression **ppEVar3;
  Expression *pEVar4;
  size_t sVar5;
  iterator __position;
  bool bVar6;
  Nop *output;
  mapped_type *pmVar7;
  LocalSet *pLVar8;
  size_type sVar9;
  _Rb_tree_node_base *p_Var10;
  uintptr_t uVar11;
  If *pIVar12;
  Block *this_00;
  Block *this_01;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  optional<wasm::Type> type__01;
  Builder local_60;
  Expression **local_58;
  Sinkables *local_50;
  map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
  *local_48;
  If *local_40;
  If *iff_local;
  
  local_40 = iff;
  if (iff->ifFalse == (Expression *)0x0) {
    __assert_fail("iff->ifFalse",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                  ,0x27a,
                  "void wasm::SimplifyLocals<>::optimizeIfElseReturn(If *, Expression **, Sinkables &) [allowTee = true, allowStructure = true, allowNesting = true]"
                 );
  }
  if ((iff->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id != 0) {
    return;
  }
  local_50 = &this->sinkables;
  this_00 = (Block *)iff->ifTrue;
  uVar11 = (iff->ifFalse->type).id;
  pIVar12 = iff;
  local_58 = currp;
  if ((this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id == 1) {
    if (uVar11 == 1) {
      local_48 = ifTrue;
      __assert_fail("iff->ifFalse->type != Type::unreachable",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                    ,0x295,
                    "void wasm::SimplifyLocals<>::optimizeIfElseReturn(If *, Expression **, Sinkables &) [allowTee = true, allowStructure = true, allowNesting = true]"
                   );
    }
    if ((this->sinkables)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      return;
    }
    iff_local._4_4_ =
         (this->sinkables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color;
    if ((this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id != BlockId
       ) {
      this_00 = (Block *)0x0;
    }
    bVar6 = true;
    local_48 = ifTrue;
  }
  else {
    if (uVar11 == 1) {
      if ((ifTrue->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
        return;
      }
      iff_local._4_4_ = (ifTrue->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color;
      if ((this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id !=
          BlockId) goto LAB_00b0585a;
    }
    else {
      p_Var10 = (ifTrue->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      local_48 = ifTrue;
      while( true ) {
        if ((_Rb_tree_header *)p_Var10 == &(ifTrue->_M_t)._M_impl.super__Rb_tree_header) {
          return;
        }
        __x = (If *)(p_Var10 + 1);
        pIVar12 = __x;
        sVar9 = std::
                map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                ::count(local_50,(key_type *)__x);
        if (sVar9 != 0) break;
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
      }
      iff_local._4_4_ =
           *(_Rb_tree_color *)
            &(__x->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression;
      pBVar2 = (Block *)iff->ifTrue;
      this_00 = (Block *)0x0;
      if ((pBVar2->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id ==
          BlockId) {
        this_00 = pBVar2;
      }
      bVar6 = true;
      if ((pBVar2->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id == 1)
      goto LAB_00b05663;
      ifTrue = local_48;
      if (this_00 == (Block *)0x0) goto LAB_00b0585a;
    }
    if ((((this_00->name).super_IString.str._M_str != (char *)0x0) ||
        (sVar5 = (this_00->list).
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                 usedElements, sVar5 == 0)) ||
       ((this_00->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
        data[sVar5 - 1]->_id != NopId)) goto LAB_00b0585a;
    bVar6 = false;
    local_48 = ifTrue;
  }
LAB_00b05663:
  pBVar2 = (Block *)iff->ifFalse;
  this_01 = (Block *)0x0;
  if ((pBVar2->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id == BlockId) {
    this_01 = pBVar2;
  }
  uVar11 = (pBVar2->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id;
  if ((uVar11 != 1) &&
     (((this_01 == (Block *)0x0 || ((this_01->name).super_IString.str._M_str != (char *)0x0)) ||
      ((sVar5 = (this_01->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                usedElements, sVar5 == 0 ||
       (pIVar12 = (If *)(this_01->list).
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                        data, **(char **)((long)pIVar12 + sVar5 * 8 + -8) != '\x16')))))) {
LAB_00b0585a:
    __position._M_current =
         (this->ifsToEnlarge).super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->ifsToEnlarge).super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<wasm::If*,std::allocator<wasm::If*>>::_M_realloc_insert<wasm::If*const&>
                ((vector<wasm::If*,std::allocator<wasm::If*>> *)&this->ifsToEnlarge,__position,
                 &local_40);
    }
    else {
      *__position._M_current = iff;
      pppIVar1 = &(this->ifsToEnlarge).super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppIVar1 = *pppIVar1 + 1;
    }
    return;
  }
  if (!bVar6) {
    pmVar7 = std::
             map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
             ::at(local_48,(key_type *)((long)&iff_local + 4));
    ppEVar3 = pmVar7->item;
    pEVar4 = *ppEVar3;
    if (pEVar4->_id != LocalSetId) goto LAB_00b058f2;
    sVar5 = (this_00->list).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
    if (sVar5 == 0) goto LAB_00b05911;
    pIVar12 = (If *)(this_00->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data;
    *(uintptr_t *)((long)pIVar12 + sVar5 * 8 + -8) = pEVar4[1].type.id;
    pEVar4 = *ppEVar3;
    pEVar4->_id = NopId;
    (pEVar4->type).id = 0;
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pIVar12;
    Block::finalize(this_00,type_,Unknown);
    if ((this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id == 0)
    {
      __assert_fail("ifTrueBlock->type != Type::none",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                    ,0x2ca,
                    "void wasm::SimplifyLocals<>::optimizeIfElseReturn(If *, Expression **, Sinkables &) [allowTee = true, allowStructure = true, allowNesting = true]"
                   );
    }
    uVar11 = (local_40->ifFalse->type).id;
    iff = local_40;
  }
  if (uVar11 != 1) {
    pmVar7 = std::
             map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
             ::at(local_50,(key_type *)((long)&iff_local + 4));
    ppEVar3 = pmVar7->item;
    pEVar4 = *ppEVar3;
    if (pEVar4->_id != LocalSetId) {
LAB_00b058f2:
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                    ,0x31b,"T *wasm::Expression::cast() [T = wasm::LocalSet]");
    }
    sVar5 = (this_01->list).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
    if (sVar5 == 0) {
LAB_00b05911:
      __assert_fail("index < usedElements",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                    ,0xbc,
                    "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                   );
    }
    pIVar12 = (If *)(this_01->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data;
    *(uintptr_t *)((long)pIVar12 + sVar5 * 8 + -8) = pEVar4[1].type.id;
    pEVar4 = *ppEVar3;
    pEVar4->_id = NopId;
    (pEVar4->type).id = 0;
    type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pIVar12;
    Block::finalize(this_01,type__00,Unknown);
    iff = local_40;
    if ((this_01->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id == 0)
    {
      __assert_fail("ifFalseBlock->type != Type::none",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                    ,0x2d2,
                    "void wasm::SimplifyLocals<>::optimizeIfElseReturn(If *, Expression **, Sinkables &) [allowTee = true, allowStructure = true, allowNesting = true]"
                   );
    }
  }
  type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pIVar12;
  If::finalize(iff,type__01);
  if ((local_40->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id != 0) {
    local_60.wasm =
         (this->
         super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
         ).
         super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
         .
         super_PostWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
         .
         super_Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
         .currModule;
    pLVar8 = Builder::makeLocalSet(&local_60,iff_local._4_4_,(Expression *)local_40);
    *local_58 = (Expression *)pLVar8;
    this->anotherCycle = true;
    return;
  }
  __assert_fail("iff->type != Type::none",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                ,0x2d5,
                "void wasm::SimplifyLocals<>::optimizeIfElseReturn(If *, Expression **, Sinkables &) [allowTee = true, allowStructure = true, allowNesting = true]"
               );
}

Assistant:

void optimizeIfElseReturn(If* iff, Expression** currp, Sinkables& ifTrue) {
    assert(iff->ifFalse);
    // if this if already has a result, or is unreachable code, we have
    // nothing to do
    if (iff->type != Type::none) {
      return;
    }
    // We now have the sinkables from both sides of the if, and can look
    // for something to sink. That is either a shared index on both sides,
    // *or* if one side is unreachable, we can sink anything from the other,
    //   (if
    //     (..)
    //     (br $x)
    //     (local.set $y (..))
    //   )
    //    =>
    //   (local.set $y
    //     (if (result i32)
    //       (..)
    //       (br $x)
    //       (..)
    //     )
    //   )
    Sinkables& ifFalse = sinkables;
    Index goodIndex = -1;
    bool found = false;
    if (iff->ifTrue->type == Type::unreachable) {
      // since the if type is none
      assert(iff->ifFalse->type != Type::unreachable);
      if (!ifFalse.empty()) {
        goodIndex = ifFalse.begin()->first;
        found = true;
      }
    } else if (iff->ifFalse->type == Type::unreachable) {
      // since the if type is none
      assert(iff->ifTrue->type != Type::unreachable);
      if (!ifTrue.empty()) {
        goodIndex = ifTrue.begin()->first;
        found = true;
      }
    } else {
      // Look for a shared index.
      for (auto& [index, _] : ifTrue) {
        if (ifFalse.count(index) > 0) {
          goodIndex = index;
          found = true;
          break;
        }
      }
    }
    if (!found) {
      return;
    }
    // great, we can optimize!
    // ensure we have a place to write the return values for, if not, we
    // need another cycle
    auto* ifTrueBlock = iff->ifTrue->dynCast<Block>();
    if (iff->ifTrue->type != Type::unreachable) {
      if (!ifTrueBlock || ifTrueBlock->name.is() ||
          ifTrueBlock->list.size() == 0 ||
          !ifTrueBlock->list.back()->is<Nop>()) {
        ifsToEnlarge.push_back(iff);
        return;
      }
    }
    auto* ifFalseBlock = iff->ifFalse->dynCast<Block>();
    if (iff->ifFalse->type != Type::unreachable) {
      if (!ifFalseBlock || ifFalseBlock->name.is() ||
          ifFalseBlock->list.size() == 0 ||
          !ifFalseBlock->list.back()->is<Nop>()) {
        ifsToEnlarge.push_back(iff);
        return;
      }
    }
    // all set, go
    if (iff->ifTrue->type != Type::unreachable) {
      auto* ifTrueItem = ifTrue.at(goodIndex).item;
      ifTrueBlock->list[ifTrueBlock->list.size() - 1] =
        (*ifTrueItem)->template cast<LocalSet>()->value;
      ExpressionManipulator::nop(*ifTrueItem);
      ifTrueBlock->finalize();
      assert(ifTrueBlock->type != Type::none);
    }
    if (iff->ifFalse->type != Type::unreachable) {
      auto* ifFalseItem = ifFalse.at(goodIndex).item;
      ifFalseBlock->list[ifFalseBlock->list.size() - 1] =
        (*ifFalseItem)->template cast<LocalSet>()->value;
      ExpressionManipulator::nop(*ifFalseItem);
      ifFalseBlock->finalize();
      assert(ifFalseBlock->type != Type::none);
    }
    iff->finalize(); // update type
    assert(iff->type != Type::none);
    // finally, create a local.set on the iff itself
    auto* newLocalSet =
      Builder(*this->getModule()).makeLocalSet(goodIndex, iff);
    *currp = newLocalSet;
    anotherCycle = true;
  }